

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

void duckdb::DisabledOptimizersSetting::ResetGlobal(DatabaseInstance *db,DBConfig *config)

{
  _Base_ptr p_Var1;
  DBConfig local_6b0;
  
  DBConfig::DBConfig(&local_6b0);
  ::std::
  _Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
  ::clear(&(config->options).disabled_optimizers._M_t);
  if (local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      != (_Base_ptr)0x0) {
    p_Var1 = &local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header;
    (config->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_color
    ;
    (config->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header.
         _M_parent;
    (config->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    (config->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_right
    ;
    (local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
    _M_parent = &(config->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header;
    (config->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         p_Var1;
    local_6b0.options.disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         p_Var1;
  }
  DBConfig::~DBConfig(&local_6b0);
  return;
}

Assistant:

void DisabledOptimizersSetting::ResetGlobal(DatabaseInstance *db, DBConfig &config) {
	config.options.disabled_optimizers = DBConfig().options.disabled_optimizers;
}